

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O1

void __thiscall agg::bspline::prepare(bspline *this)

{
  double *pdVar1;
  double *__s;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar2 = this->m_num;
  lVar8 = (long)(int)uVar2;
  if (2 < lVar8) {
    uVar5 = (ulong)uVar2;
    lVar7 = 0;
    memset((this->m_am).m_array,0,uVar5 * 8);
    __s = (double *)operator_new__(uVar5 * 0x18);
    uVar3 = 1;
    if (1 < (int)(uVar5 * 3)) {
      uVar3 = uVar5 * 3 & 0xffffffff;
    }
    memset(__s,0,uVar3 << 3);
    uVar3 = (ulong)(uVar2 * 2);
    uVar2 = uVar2 - 1;
    pdVar1 = this->m_x;
    pdVar6 = this->m_y;
    uVar4 = 2;
    if (2 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    dVar13 = (pdVar6[1] - *pdVar6) / (pdVar1[1] - *pdVar1);
    dVar10 = pdVar1[1] - *pdVar1;
    do {
      dVar11 = *(double *)((long)pdVar1 + lVar7 + 0x10) - *(double *)((long)pdVar1 + lVar7 + 8);
      dVar12 = (*(double *)((long)pdVar6 + lVar7 + 0x10) - *(double *)((long)pdVar6 + lVar7 + 8)) /
               dVar11;
      dVar14 = dVar11 / (dVar10 + dVar11);
      *(double *)((long)__s + lVar7 + 8) = dVar14;
      *(double *)((long)__s + lVar7 + uVar5 * 8 + 8) = 1.0 - dVar14;
      *(double *)((long)__s + lVar7 + uVar3 * 8 + 8) = ((dVar12 - dVar13) * 6.0) / (dVar10 + dVar11)
      ;
      lVar7 = lVar7 + 8;
      dVar13 = dVar12;
      dVar10 = dVar11;
    } while (uVar4 * 8 + -8 != lVar7);
    dVar13 = __s[uVar3];
    lVar7 = uVar4 - 1;
    pdVar1 = __s;
    do {
      pdVar6 = pdVar1 + 1;
      dVar10 = pdVar6[uVar5];
      dVar11 = 1.0 / (*pdVar1 * dVar10 + 2.0);
      *pdVar6 = -dVar11 * *pdVar6;
      dVar13 = (pdVar6[uVar3] - dVar13 * dVar10) * dVar11;
      pdVar6[uVar3] = dVar13;
      lVar7 = lVar7 + -1;
      pdVar1 = pdVar6;
    } while (lVar7 != 0);
    pdVar1 = (this->m_am).m_array;
    pdVar1[uVar2] = 0.0;
    uVar5 = lVar8 - 2;
    dVar13 = __s[uVar3 + lVar8 + -2];
    __s[uVar5 & 0xffffffff] = dVar13;
    pdVar1[uVar5 & 0xffffffff] = dVar13;
    uVar9 = lVar8 - 3;
    uVar4 = 1;
    if (1 < (int)uVar5) {
      uVar4 = uVar5 & 0xffffffff;
    }
    do {
      uVar5 = uVar9 & 0xffffffff;
      dVar13 = __s[uVar5] * __s[(int)uVar9 + 1] + __s[uVar3 + uVar9];
      __s[uVar5] = dVar13;
      pdVar1[uVar5] = dVar13;
      uVar9 = uVar9 - 1;
      uVar2 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar2;
    } while (uVar2 != 0);
    operator_delete__(__s);
  }
  this->m_last_idx = -1;
  return;
}

Assistant:

void bspline::prepare()
    {
        if(m_num > 2)
        {
            int i, k, n1;
            double* temp; 
            double* r; 
            double* s;
            double h, p, d, f, e;
    
            for(k = 0; k < m_num; k++) 
            {
                m_am[k] = 0.0;
            }

            n1 = 3 * m_num;

            pod_array<double> al(n1);
            temp = &al[0];

            for(k = 0; k < n1; k++) 
            {
                temp[k] = 0.0;
            }

            r = temp + m_num;
            s = temp + m_num * 2;

            n1 = m_num - 1;
            d = m_x[1] - m_x[0];
            e = (m_y[1] - m_y[0]) / d;

            for(k = 1; k < n1; k++) 
            {
                h     = d;
                d     = m_x[k + 1] - m_x[k];
                f     = e;
                e     = (m_y[k + 1] - m_y[k]) / d;
                al[k] = d / (d + h);
                r[k]  = 1.0 - al[k];
                s[k]  = 6.0 * (e - f) / (h + d);
            }

            for(k = 1; k < n1; k++) 
            {
                p = 1.0 / (r[k] * al[k - 1] + 2.0);
                al[k] *= -p;
                s[k] = (s[k] - r[k] * s[k - 1]) * p; 
            }

            m_am[n1]     = 0.0;
            al[n1 - 1]   = s[n1 - 1];
            m_am[n1 - 1] = al[n1 - 1];

            for(k = n1 - 2, i = 0; i < m_num - 2; i++, k--) 
            {
                al[k]   = al[k] * al[k + 1] + s[k];
                m_am[k] = al[k];
            }
        }
        m_last_idx = -1;
    }